

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall WriterTest_WriteChar_Test::TestBody(WriterTest_WriteChar_Test *this)

{
  bool bVar1;
  Message *in_stack_00000028;
  AssertHelper *in_stack_00000030;
  AssertionResult gtest_ar;
  AssertionResult *this_00;
  char *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  Type in_stack_ffffffffffffffdc;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 uVar2;
  undefined1 in_stack_ffffffffffffffe7;
  AnyWriteChecker *in_stack_ffffffffffffffe8;
  
  uVar2 = 0x61;
  this_00 = (AssertionResult *)&stack0xffffffffffffffe8;
  (anonymous_namespace)::AnyWriteChecker::operator()
            (in_stack_ffffffffffffffe8,
             (char *)CONCAT17(in_stack_ffffffffffffffe7,CONCAT16(0x61,in_stack_ffffffffffffffe0)),
             (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_ffffffffffffffe7,CONCAT16(uVar2,in_stack_ffffffffffffffe0)));
    testing::AssertionResult::failure_message((AssertionResult *)0x12bd56);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_ffffffffffffffe7,CONCAT16(uVar2,in_stack_ffffffffffffffe0)),
               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc0);
    testing::internal::AssertHelper::operator=(in_stack_00000030,in_stack_00000028);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0x12bda2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12bde2);
  return;
}

Assistant:

TEST(WriterTest, WriteChar) {
  CHECK_WRITE('a');
}